

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void INT_CMregister_non_CM_message_handler(int header,CMNonCMHandler handler)

{
  CMNonCMHandler in_RSI;
  int in_EDI;
  size_t in_stack_ffffffffffffffe8;
  
  if (foreign_handler_count < 1) {
    foreign_handler_list = (handler_list)INT_CMmalloc((size_t)in_RSI);
  }
  else {
    foreign_handler_list = (handler_list)INT_CMrealloc(in_RSI,in_stack_ffffffffffffffe8);
  }
  foreign_handler_list[foreign_handler_count].header = in_EDI;
  foreign_handler_list[foreign_handler_count].handler = in_RSI;
  foreign_handler_count = foreign_handler_count + 1;
  return;
}

Assistant:

extern void
 INT_CMregister_non_CM_message_handler(int header, CMNonCMHandler handler)
 {
     if (foreign_handler_count > 0) {
	 foreign_handler_list = INT_CMrealloc(foreign_handler_list, 
					  sizeof(foreign_handler_list[0]) * 
					  (foreign_handler_count + 1));
     } else {
	 foreign_handler_list = INT_CMmalloc(sizeof(foreign_handler_list[0]));
/*	 atexit(clear_foreign_handlers);*/
     }
     foreign_handler_list[foreign_handler_count].header = header;
     foreign_handler_list[foreign_handler_count].handler = handler;
     foreign_handler_count++;
 }